

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::mouseReleaseEvent(QTextEdit *this,QMouseEvent *e)

{
  QTextEditPrivate *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  long in_FS_OFFSET;
  QPointF local_48;
  QPoint local_38;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  QTextEditPrivate::sendControlEvent(this_00,(QEvent *)e);
  iVar3 = QMouseEvent::source();
  if ((iVar3 == 0) && ((this_00->autoScrollTimer).m_id != Invalid)) {
    QBasicTimer::stop();
    (**(code **)(**(long **)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                       field_0x8 + 0x2f8) + 0x60))();
  }
  bVar1 = isReadOnly(this);
  if (!bVar1) {
    local_30 = QWidget::rect((QWidget *)this);
    local_48 = QSinglePointEvent::position((QSinglePointEvent *)e);
    local_38 = QPointF::toPoint(&local_48);
    cVar2 = QRect::contains((QPoint *)&local_30,SUB81(&local_38,0));
    if (cVar2 != '\0') {
      QWidgetPrivate::handleSoftwareInputPanel
                ((QWidgetPrivate *)this_00,*(MouseButton *)(e + 0x40),
                 (bool)((this_00->field_0x320 & 0x10) >> 4));
    }
  }
  this_00->field_0x320 = this_00->field_0x320 & 0xef;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QTextEdit);
    d->sendControlEvent(e);
    if (e->source() == Qt::MouseEventNotSynthesized && d->autoScrollTimer.isActive()) {
        d->autoScrollTimer.stop();
        ensureCursorVisible();
    }
    if (!isReadOnly() && rect().contains(e->position().toPoint()))
        d->handleSoftwareInputPanel(e->button(), d->clickCausedFocus);
    d->clickCausedFocus = 0;
}